

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_command_line_params.cpp
# Opt level: O2

bool crnlib::command_line_params::split_params(char *p,dynamic_string_array *params)

{
  char c;
  bool bVar1;
  ulong uVar2;
  bool bVar3;
  dynamic_string str;
  dynamic_string local_40;
  
  local_40.m_buf_size = 0;
  local_40.m_len = 0;
  local_40.m_pStr = (char *)0x0;
  bVar3 = false;
  bVar1 = false;
  uVar2 = 0;
  do {
    c = p[uVar2];
    if (c == '\0') {
      if (bVar1) {
        console::error("Unmatched quote in command line \"%s\"",p);
      }
      else if (local_40.m_len != 0) {
        vector<crnlib::dynamic_string>::push_back(params,&local_40);
      }
      dynamic_string::~dynamic_string(&local_40);
      return (bool)~bVar1;
    }
    if (bVar3) {
      if (bVar1) {
        if (c == '\"') {
          bVar1 = false;
        }
        dynamic_string::append_char(&local_40,c);
        bVar3 = true;
      }
      else if (c == '\t') {
LAB_0010c8a8:
        if (local_40.m_len != 0) {
          vector<crnlib::dynamic_string>::push_back(params,&local_40);
          dynamic_string::clear(&local_40);
        }
        bVar3 = false;
      }
      else {
        if (c == '\"') {
          bVar1 = true;
        }
        else if (c == ' ') goto LAB_0010c8a8;
        bVar3 = true;
        dynamic_string::append_char(&local_40,c);
      }
    }
    else {
      bVar3 = false;
      if ((c != '\t') && (c != ' ')) {
        if (c == '\"') {
          bVar1 = true;
        }
        bVar3 = true;
        dynamic_string::append_char(&local_40,c);
      }
    }
    uVar2 = (ulong)((int)uVar2 + 1);
  } while( true );
}

Assistant:

bool command_line_params::split_params(const char* p, dynamic_string_array& params) {
  bool within_param = false;
  bool within_quote = false;

  uint ofs = 0;
  dynamic_string str;

  while (p[ofs]) {
    const char c = p[ofs];

    if (within_param) {
      if (within_quote) {
        if (c == '"')
          within_quote = false;

        str.append_char(c);
      } else if ((c == ' ') || (c == '\t')) {
        if (!str.is_empty()) {
          params.push_back(str);
          str.clear();
        }
        within_param = false;
      } else {
        if (c == '"')
          within_quote = true;

        str.append_char(c);
      }
    } else if ((c != ' ') && (c != '\t')) {
      within_param = true;

      if (c == '"')
        within_quote = true;

      str.append_char(c);
    }

    ofs++;
  }

  if (within_quote) {
    console::error("Unmatched quote in command line \"%s\"", p);
    return false;
  }

  if (!str.is_empty())
    params.push_back(str);

  return true;
}